

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::InitialLength>::mapping
               (IO *IO,InitialLength *InitialLength)

{
  bool bVar1;
  InitialLength *InitialLength_local;
  IO *IO_local;
  
  yaml::IO::mapRequired<unsigned_int>(IO,"TotalLength",&InitialLength->TotalLength);
  bVar1 = DWARFYAML::InitialLength::isDWARF64(InitialLength);
  if (bVar1) {
    yaml::IO::mapRequired<unsigned_long>(IO,"TotalLength64",&InitialLength->TotalLength64);
  }
  return;
}

Assistant:

void MappingTraits<DWARFYAML::InitialLength>::mapping(
    IO &IO, DWARFYAML::InitialLength &InitialLength) {
  IO.mapRequired("TotalLength", InitialLength.TotalLength);
  if (InitialLength.isDWARF64())
    IO.mapRequired("TotalLength64", InitialLength.TotalLength64);
}